

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetErrorBias(void *arkode_mem,sunrealtype bias)

{
  double in_XMM0_Qa;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  ARKodeMem in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_1c;
  int local_4;
  
  local_4 = arkAccessHAdaptMem(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8,(ARKodeHAdaptMem *)0x151b9a);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd0->step_supports_adaptive == 0) {
      arkProcessError(in_stack_ffffffffffffffd0,-0x30,0x667,"ARKodeSetErrorBias",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
      local_4 = -0x30;
    }
    else {
      if (1.0 <= in_XMM0_Qa) {
        local_1c = SUNAdaptController_SetErrorBias
                             (in_XMM0_Qa,*(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x68));
      }
      else {
        local_1c = SUNAdaptController_SetErrorBias
                             (0xbff0000000000000,
                              *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x68));
      }
      if (local_1c == 0) {
        local_4 = 0;
      }
      else {
        arkProcessError(in_stack_ffffffffffffffd0,-0x2f,0x677,"ARKodeSetErrorBias",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                        ,"SUNAdaptController_SetErrorBias failure");
        local_4 = -0x2f;
      }
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetErrorBias(void* arkode_mem, sunrealtype bias)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* set allowed value, otherwise set default */
  if (bias < ONE)
  {
    retval = SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller, -ONE);
  }
  else
  {
    retval = SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller, bias);
  }
  if (retval != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__, __FILE__,
                    "SUNAdaptController_SetErrorBias failure");
    return (ARK_CONTROLLER_ERR);
  }
  return (ARK_SUCCESS);
}